

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.c
# Opt level: O0

void * readerThread(void *arg)

{
  dsList *list_00;
  int *data;
  dsListEntry *e;
  dsList *list;
  dsCrate *crate;
  void *arg_local;
  
  dsOpen("myCrate",0,1);
  list_00 = (dsList *)dsGetIndex();
  for (data = (int *)dsListBegin(list_00); data != (int *)0x0;
      data = (int *)dsListNext((dsListEntry *)data)) {
    dsListData((dsListEntry *)data);
  }
  return (void *)0x0;
}

Assistant:

static void *
readerThread(void *arg)
{
	dsCrate *crate = dsOpen("myCrate", 0, 1);

	dsList *list = dsGetIndex();

	dsListEntry *e;
	for (e = dsListBegin(list); e != NULL; e = dsListNext(e)) {
		int *data = dsListData(e);
	}

	return(NULL);
}